

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteFixed32
               (int field_number,uint32 value,CodedOutputStream *output)

{
  CodedOutputStream *in_RDX;
  uint32 in_EDI;
  CodedOutputStream *this;
  CodedOutputStream *this_00;
  
  this = in_RDX;
  this_00 = in_RDX;
  MakeTag(in_EDI,WIRETYPE_FIXED32);
  io::CodedOutputStream::WriteTag(this,(uint32)((ulong)in_RDX >> 0x20));
  io::CodedOutputStream::WriteLittleEndian32(this_00,in_EDI);
  return;
}

Assistant:

void WireFormatLite::WriteFixed32(int field_number, uint32 value,
                                  io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED32, output);
  WriteFixed32NoTag(value, output);
}